

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

void Omega_h::find_matches
               (Omega_h_Family family,Int dim,LOs *av2v,LOs *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out)

{
  Int ncomps;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Read<int> a2fv;
  Write<int> local_70;
  Adj local_60;
  
  if (2 < dim) {
    fail("assertion %s failed at %s +%d\n","dim <= 2",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x1a2);
  }
  if (family == OMEGA_H_SIMPLEX) {
    ncomps = -1;
    if ((uint)dim < 3) {
      ncomps = dim + 1;
    }
  }
  else if ((uint)dim < 3) {
    ncomps = *(Int *)(&DAT_0037770c + (ulong)(uint)dim * 4);
  }
  else {
    ncomps = -1;
  }
  Write<int>::Write(&local_70,&av2v->write_);
  get_component<int>((Omega_h *)&a2fv,(Read<int> *)&local_70,ncomps,0);
  Write<int>::~Write(&local_70);
  Write<int>::Write(&local_90,&a2fv.write_);
  Write<int>::Write(&local_a0,&av2v->write_);
  Write<int>::Write(&local_b0,&bv2v->write_);
  Adj::Adj(&local_60,v2b);
  find_matches_ex<int>
            (ncomps,(LOs *)&local_90,(Read<int> *)&local_a0,(Read<int> *)&local_b0,&local_60,a2b_out
             ,codes_out,false);
  Adj::~Adj(&local_60);
  Write<int>::~Write(&local_b0);
  Write<int>::~Write(&local_a0);
  Write<int>::~Write(&local_90);
  Write<int>::~Write(&a2fv.write_);
  return;
}

Assistant:

void find_matches(Omega_h_Family const family, Int const dim, LOs const av2v,
    LOs const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out) {
  OMEGA_H_CHECK(dim <= 2);
  auto const deg = element_degree(family, dim, VERT);
  auto const a2fv = get_component(av2v, deg, 0);
  find_matches_ex(deg, a2fv, av2v, bv2v, v2b, a2b_out, codes_out);
}